

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barray.c
# Opt level: O0

int bit_array_test_range(void *array,size_t bit,size_t count)

{
  bool bVar1;
  uchar *ptr;
  size_t *size;
  size_t count_local;
  size_t bit_local;
  void *array_local;
  
  if ((array != (void *)0x0) && (bit < *array)) {
    count_local = count;
    bit_local = bit;
    if (((bit & 7) != 0) && (8 < count)) {
      while( true ) {
        bVar1 = false;
        if ((bit_local < *array) && (bVar1 = false, count_local != 0)) {
          bVar1 = (bit_local & 7) != 0;
        }
        if (!bVar1) break;
        if (((uint)*(byte *)((long)array + (bit_local >> 3) + 8) & 1 << ((byte)bit_local & 7)) != 0)
        {
          return 1;
        }
        bit_local = bit_local + 1;
        count_local = count_local - 1;
      }
    }
    if ((bit_local & 7) == 0) {
      for (; 7 < *array - bit_local && 7 < count_local; bit_local = bit_local + 8) {
        if (*(char *)((long)array + (bit_local >> 3) + 8) != '\0') {
          return 1;
        }
        count_local = count_local - 8;
      }
    }
    for (; bit_local < *array && count_local != 0; bit_local = bit_local + 1) {
      if (((uint)*(byte *)((long)array + (bit_local >> 3) + 8) & 1 << ((byte)bit_local & 7)) != 0) {
        return 1;
      }
      count_local = count_local - 1;
    }
  }
  return 0;
}

Assistant:

int bit_array_test_range(void * array, size_t bit, size_t count)
{
	if (array)
	{
		size_t * size = (size_t *) array;
		if (bit < *size)
		{
			unsigned char * ptr = (unsigned char *)(size + 1);
			if ((bit & 7) && (count > 8))
			{
				while ((bit < *size) && count && (bit & 7))
				{
					if (ptr[bit >> 3] & (1U << (bit & 7))) return 1;
					bit++;
					count--;
				}
			}
			if (!(bit & 7))
			{
				while (((*size - bit) >= 8) && (count >= 8))
				{
					if (ptr[bit >> 3]) return 1;
					bit += 8;
					count -= 8;
				}
			}
			while ((bit < *size) && count)
			{
				if (ptr[bit >> 3] & (1U << (bit & 7))) return 1;
				bit++;
				count--;
			}
		}
	}
	return 0;
}